

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode SecureChannelHandshake(UA_Client *client,UA_Boolean renew)

{
  UA_Connection *connection;
  long lVar1;
  UA_Logger logger;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  UA_DateTime UVar7;
  char *pcVar8;
  char *msg;
  UA_ByteString *p;
  int iVar9;
  undefined7 in_register_00000031;
  uint uVar10;
  UA_UInt32 UVar11;
  undefined8 local_238;
  size_t sStack_230;
  UA_Byte *local_228;
  UA_DateTime local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  size_t local_1b8;
  UA_Byte *pUStack_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  UA_OpenSecureChannelResponse response;
  undefined1 local_b8 [8];
  UA_NodeId expectedRequest;
  UA_NodeId requestType;
  UA_SequenceHeader seqHeader;
  UA_ByteString local_78;
  UA_SecureConversationMessageHeader local_64;
  undefined1 local_58 [8];
  UA_ByteString message;
  size_t local_40;
  size_t offset;
  UA_Boolean realloced;
  
  iVar9 = (int)CONCAT71(in_register_00000031,renew);
  if ((iVar9 != 0) &&
     (lVar1 = client->nextChannelRenewal, UVar7 = UA_DateTime_nowMonotonic(), UVar7 < lVar1)) {
    return 0;
  }
  UVar3 = 0x800d0000;
  if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
    connection = &client->connection;
    UVar3 = (*(client->connection).getSendBuffer)
                      (connection,(ulong)(client->connection).remoteConf.recvBufferSize,
                       (UA_ByteString *)local_58);
    if (UVar3 == 0) {
      local_40 = 0xc;
      join_0x00000010_0x00000000_ = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
      UVar4 = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary
                        ((UA_AsymmetricAlgorithmSecurityHeader *)&response.serverNonce.data,
                         (UA_ByteString *)local_58,&local_40);
      requestType.identifier._8_4_ = (client->channel).sendSequenceNumber + 1;
      (client->channel).sendSequenceNumber = requestType.identifier._8_4_;
      requestType.identifier._12_4_ = client->requestId + 1;
      client->requestId = requestType.identifier._12_4_;
      UVar5 = UA_SequenceHeader_encodeBinary
                        ((UA_SequenceHeader *)&requestType.identifier.string.data,
                         (UA_ByteString *)local_58,&local_40);
      expectedRequest.identifier._8_2_ = 0;
      stack0xffffffffffffff64 = 0x1be00000000;
      message.data._0_4_ =
           UA_NodeId_encodeBinary
                     ((UA_NodeId *)((long)&expectedRequest.identifier + 8),(UA_ByteString *)local_58
                      ,&local_40);
      local_1b8 = 0;
      pUStack_1b0 = (UA_Byte *)0x0;
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_208 = 0;
      uStack_200 = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_1a8 = 0;
      local_220 = UA_DateTime_now();
      local_238._0_2_ = (client->authenticationToken).namespaceIndex;
      local_238._2_2_ = *(undefined2 *)&(client->authenticationToken).field_0x2;
      local_238._4_4_ = (client->authenticationToken).identifierType;
      sStack_230 = (client->authenticationToken).identifier.string.length;
      local_228 = (client->authenticationToken).identifier.string.data;
      local_1c8 = (ulong)CONCAT14(renew,(undefined4)local_1c8);
      uStack_1c0 = CONCAT44(uStack_1c0._4_4_,1);
      local_1b8 = (client->channel).clientNonce.length;
      pUStack_1b0 = (client->channel).clientNonce.data;
      local_1a8 = CONCAT44(local_1a8._4_4_,(client->config).secureChannelLifeTime);
      UVar11 = 0;
      message.data._4_4_ = iVar9;
      UVar3 = UA_encodeBinary(&local_238,UA_TYPES + 0x61,(UA_exchangeEncodeBuffer)0x0,(void *)0x0,
                              (UA_ByteString *)local_58,&local_40);
      uVar10 = UVar3 | (UA_StatusCode)message.data;
      local_64.messageHeader.messageTypeAndChunkType = 0x464e504f;
      local_64.messageHeader.messageSize = (uint)local_40;
      if (renew) {
        UVar11 = (client->channel).securityToken.channelId;
      }
      local_40 = 0;
      local_64.secureChannelId = UVar11;
      UVar3 = UA_SecureConversationMessageHeader_encodeBinary
                        (&local_64,(UA_ByteString *)local_58,&local_40);
      UVar3 = uVar10 | UVar5 | UVar4 | UVar3;
      if (UVar3 == 0) {
        local_58 = (undefined1  [8])(ulong)local_64.messageHeader.messageSize;
        UVar3 = (*(client->connection).send)(connection,(UA_ByteString *)local_58);
        if (UVar3 == 0) {
          local_78.length = 0;
          local_78.data = (UA_Byte *)0x0;
          offset._7_1_ = '\0';
          UVar3 = UA_Connection_receiveChunksBlocking
                            (connection,&local_78,(UA_Boolean *)((long)&offset + 7),
                             (client->config).timeout);
          if (UVar3 == 0) {
            local_40 = 0;
            UVar3 = UA_SecureConversationMessageHeader_decodeBinary(&local_78,&local_40,&local_64);
            UVar4 = UA_AsymmetricAlgorithmSecurityHeader_decodeBinary
                              (&local_78,&local_40,
                               (UA_AsymmetricAlgorithmSecurityHeader *)&response.serverNonce.data);
            UVar5 = UA_SequenceHeader_decodeBinary
                              (&local_78,&local_40,
                               (UA_SequenceHeader *)&requestType.identifier.string.data);
            UVar6 = UA_NodeId_decodeBinary
                              (&local_78,&local_40,
                               (UA_NodeId *)((long)&expectedRequest.identifier + 8));
            local_b8._0_2_ = 0;
            stack0xffffffffffffff4c = 0x1c100000000;
            if ((UVar6 == 0 && (UVar5 == 0 && (UVar4 == 0 && UVar3 == 0))) &&
               (UVar2 = UA_NodeId_equal((UA_NodeId *)((long)&expectedRequest.identifier + 8),
                                        (UA_NodeId *)local_b8), UVar2)) {
              (client->channel).receiveSequenceNumber = requestType.identifier._8_4_;
              UVar3 = UA_decodeBinary(&local_78,&local_40,local_1a0,UA_TYPES + 0x54);
              if (offset._7_1_ == '\0') {
                (*(client->connection).releaseRecvBuffer)(connection,&local_78);
              }
              else {
                UA_ByteString_deleteMembers(&local_78);
              }
              iVar9 = message.data._4_4_;
              uVar10 = UVar3 | response.responseHeader.timestamp._4_4_;
              if (uVar10 == 0) {
                UVar7 = UA_DateTime_nowMonotonic();
                client->nextChannelRenewal =
                     (long)((double)(uint)response.securityToken.createdAt * 10000.0 * 0.75) + UVar7
                ;
                *(ulong *)&(client->channel).securityToken.revisedLifetime =
                     CONCAT44(response.securityToken.createdAt._4_4_,
                              (uint)response.securityToken.createdAt);
                (client->channel).securityToken.channelId = response.serverProtocolVersion;
                (client->channel).securityToken.tokenId = response._140_4_;
                (client->channel).securityToken.createdAt = response.securityToken._0_8_;
                p = &(client->channel).serverNonce;
                UA_ByteString_deleteMembers(p);
                UA_ByteString_copy((UA_ByteString *)&response.securityToken.revisedLifetime,p);
              }
              else {
                logger = (client->config).logger;
                pcVar8 = UA_StatusCode_name(uVar10);
                if ((char)iVar9 == '\0') {
                  msg = "SecureChannel could not be opened with error code %s";
                }
                else {
                  msg = "SecureChannel could not be renewed with error code %s";
                }
                UA_LOG_INFO(logger,UA_LOGCATEGORY_SECURECHANNEL,msg,pcVar8);
              }
              UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                        ((UA_AsymmetricAlgorithmSecurityHeader *)&response.serverNonce.data);
              UA_OpenSecureChannelResponse_deleteMembers((UA_OpenSecureChannelResponse *)local_1a0);
              return uVar10;
            }
            UA_ByteString_deleteMembers(&local_78);
            UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                      ((UA_AsymmetricAlgorithmSecurityHeader *)&response.serverNonce.data);
            UA_NodeId_deleteMembers((UA_NodeId *)((long)&expectedRequest.identifier + 8));
            UVar3 = 0x80020000;
          }
        }
      }
      else {
        (*(client->connection).releaseSendBuffer)(connection,(UA_ByteString *)local_58);
      }
    }
  }
  return UVar3;
}

Assistant:

static UA_StatusCode
SecureChannelHandshake(UA_Client *client, UA_Boolean renew) {
    /* Check if sc is still valid */
    if(renew && client->nextChannelRenewal - UA_DateTime_nowMonotonic() > 0)
        return UA_STATUSCODE_GOOD;

    UA_Connection *conn = &client->connection;
    if(conn->state != UA_CONNECTION_ESTABLISHED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_ByteString message;
    UA_StatusCode retval = conn->getSendBuffer(conn, conn->remoteConf.recvBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Jump over the messageHeader that will be encoded last */
    size_t offset = 12;

    /* Encode the Asymmetric Security Header */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_AsymmetricAlgorithmSecurityHeader_init(&asymHeader);
    asymHeader.securityPolicyUri = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
    retval = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &message, &offset);

    /* Encode the sequence header */
    UA_SequenceHeader seqHeader;
    seqHeader.sequenceNumber = ++client->channel.sendSequenceNumber;
    seqHeader.requestId = ++client->requestId;
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &message, &offset);

    /* Encode the NodeId of the OpenSecureChannel Service */
    UA_NodeId requestType =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELREQUEST].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&requestType, &message, &offset);

    /* Encode the OpenSecureChannelRequest */
    UA_OpenSecureChannelRequest opnSecRq;
    UA_OpenSecureChannelRequest_init(&opnSecRq);
    opnSecRq.requestHeader.timestamp = UA_DateTime_now();
    opnSecRq.requestHeader.authenticationToken = client->authenticationToken;
    if(renew) {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_RENEW;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to renew the SecureChannel");
    } else {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_ISSUE;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to open a SecureChannel");
    }
    opnSecRq.securityMode = UA_MESSAGESECURITYMODE_NONE;
    opnSecRq.clientNonce = client->channel.clientNonce;
    opnSecRq.requestedLifetime = client->config.secureChannelLifeTime;
    retval |= UA_OpenSecureChannelRequest_encodeBinary(&opnSecRq, &message, &offset);

    /* Encode the message header at the beginning */
    UA_SecureConversationMessageHeader messageHeader;
    messageHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    messageHeader.messageHeader.messageSize = (UA_UInt32)offset;
    if(renew)
        messageHeader.secureChannelId = client->channel.securityToken.channelId;
    else
        messageHeader.secureChannelId = 0;
    offset = 0;
    retval |= UA_SecureConversationMessageHeader_encodeBinary(&messageHeader, &message, &offset);

    /* Clean up and return if encoding the message failed */
    if(retval != UA_STATUSCODE_GOOD) {
        client->connection.releaseSendBuffer(&client->connection, &message);
        return retval;
    }

    /* Send the message */
    message.length = messageHeader.messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Receive the response */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Receiving OpenSecureChannelResponse failed");
        return retval;
    }

    /* Decode the header */
    offset = 0;
    retval = UA_SecureConversationMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(&reply, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(&reply, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(&reply, &offset, &requestType);
    UA_NodeId expectedRequest =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    if(retval != UA_STATUSCODE_GOOD || !UA_NodeId_equal(&requestType, &expectedRequest)) {
        UA_ByteString_deleteMembers(&reply);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong request. Expected OpenSecureChannelResponse.");
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Save the sequence number from server */
    client->channel.receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Decode the response */
    UA_OpenSecureChannelResponse response;
    retval = UA_OpenSecureChannelResponse_decodeBinary(&reply, &offset, &response);

    /* Free the message */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Results in either the StatusCode of decoding or the service */
    retval |= response.responseHeader.serviceResult;

    if(retval == UA_STATUSCODE_GOOD) {
        /* Response.securityToken.revisedLifetime is UInt32 we need to cast it
         * to DateTime=Int64 we take 75% of lifetime to start renewing as
         *  described in standard */
        client->nextChannelRenewal = UA_DateTime_nowMonotonic() +
            (UA_DateTime)(response.securityToken.revisedLifetime * (UA_Double)UA_MSEC_TO_DATETIME * 0.75);

        /* Replace the old nonce */
        UA_ChannelSecurityToken_deleteMembers(&client->channel.securityToken);
        UA_ChannelSecurityToken_copy(&response.securityToken, &client->channel.securityToken);
        UA_ByteString_deleteMembers(&client->channel.serverNonce);
        UA_ByteString_copy(&response.serverNonce, &client->channel.serverNonce);

        if(renew)
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel renewed");
        else
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel opened");
    } else {
        if(renew)
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be renewed "
                        "with error code %s", UA_StatusCode_name(retval));
        else
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be opened "
                        "with error code %s", UA_StatusCode_name(retval));
    }

    /* Clean up */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
    UA_OpenSecureChannelResponse_deleteMembers(&response);
    return retval;
}